

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O0

bool cmGetTargetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  MessageType t;
  cmValue cVar1;
  cmExecutionStatus *this;
  bool bVar2;
  PolicyStatus PVar3;
  size_type sVar4;
  const_reference __lhs;
  cmMakefile *this_00;
  const_reference pvVar5;
  cmGlobalGenerator *this_01;
  ulong uVar6;
  string *psVar7;
  ostream *poVar8;
  PolicyID id;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string_view local_2a8;
  string_view local_298;
  int local_284;
  string local_280;
  string local_260;
  MessageType local_23c;
  undefined1 local_238 [4];
  MessageType messageType;
  ostringstream e;
  bool issueMessage;
  cmValue local_a8;
  cmValue prop_cstr;
  cmTarget *tgt;
  cmMakefile *mf;
  string local_88 [7];
  bool prop_exists;
  string prop;
  string *targetName;
  string *var;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar4 != 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00609565;
  }
  __lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local,0);
  prop.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local,1);
  std::__cxx11::string::string(local_88);
  mf._7_1_ = false;
  this_00 = cmExecutionStatus::GetMakefile(local_20);
  prop_cstr.Value =
       (string *)cmMakefile::FindTargetToUse(this_00,(string *)prop.field_2._8_8_,false);
  if (prop_cstr.Value == (string *)0x0) {
    bVar2 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    local_23c = AUTHOR_WARNING;
    PVar3 = cmMakefile::GetPolicyStatus(this_00,CMP0045,false);
    if (PVar3 != OLD) {
      if (PVar3 == WARN) {
        bVar2 = true;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_260,(cmPolicies *)0x2d,id);
        poVar8 = std::operator<<((ostream *)local_238,(string *)&local_260);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&local_260);
      }
      else if (PVar3 - NEW < 3) {
        bVar2 = true;
        local_23c = FATAL_ERROR;
      }
    }
    if (bVar2) {
      poVar8 = std::operator<<((ostream *)local_238,
                               "get_target_property() called with non-existent target \"");
      poVar8 = std::operator<<(poVar8,(string *)prop.field_2._8_8_);
      std::operator<<(poVar8,"\".");
      t = local_23c;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,t,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      if (local_23c != FATAL_ERROR) goto LAB_00609406;
      args_local._7_1_ = 0;
      local_284 = 1;
    }
    else {
LAB_00609406:
      local_284 = 0;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    if (local_284 == 0) goto LAB_0060943f;
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"ALIASED_TARGET");
    if (!bVar2) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      bVar2 = std::operator==(pvVar5,"ALIAS_GLOBAL");
      if (!bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local,2);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          cmValue::cmValue(&local_a8,(nullptr_t)0x0);
          cVar1 = prop_cstr;
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,2);
          local_a8 = cmTarget::GetComputedProperty(cVar1.Value,pvVar5,this_00);
          bVar2 = cmValue::operator_cast_to_bool(&local_a8);
          cVar1 = prop_cstr;
          if (!bVar2) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,2);
            local_a8 = cmTarget::GetProperty(cVar1.Value,pvVar5);
          }
          mf._7_1_ = cmValue::operator_cast_to_bool(&local_a8);
          if (mf._7_1_) {
            psVar7 = cmValue::operator*[abi_cxx11_(&local_a8);
            std::__cxx11::string::operator=(local_88,(string *)psVar7);
          }
        }
        goto LAB_0060943f;
      }
    }
    bVar2 = cmMakefile::IsAlias(this_00,(string *)prop.field_2._8_8_);
    if (bVar2) {
      mf._7_1_ = true;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      bVar2 = std::operator==(pvVar5,"ALIASED_TARGET");
      if (bVar2) {
        psVar7 = cmTarget::GetName_abi_cxx11_(prop_cstr.Value);
        std::__cxx11::string::operator=(local_88,(string *)psVar7);
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      bVar2 = std::operator==(pvVar5,"ALIAS_GLOBAL");
      if (bVar2) {
        this_01 = cmMakefile::GetGlobalGenerator(this_00);
        bVar2 = cmGlobalGenerator::IsAlias(this_01,(string *)prop.field_2._8_8_);
        pcVar9 = "FALSE";
        if (bVar2) {
          pcVar9 = "TRUE";
        }
        std::__cxx11::string::operator=(local_88,pcVar9);
      }
    }
LAB_0060943f:
    if (mf._7_1_ == false) {
      std::operator+(&local_2c8,__lhs,"-NOTFOUND");
      local_2a8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2c8);
      cmMakefile::AddDefinition(this_00,__lhs,local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      args_local._7_1_ = 1;
      local_284 = 1;
    }
    else {
      local_298 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_88);
      cmMakefile::AddDefinition(this_00,__lhs,local_298);
      args_local._7_1_ = 1;
      local_284 = 1;
    }
  }
  std::__cxx11::string::~string(local_88);
LAB_00609565:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmGetTargetPropertyCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& targetName = args[1];
  std::string prop;
  bool prop_exists = false;
  cmMakefile& mf = status.GetMakefile();

  if (cmTarget* tgt = mf.FindTargetToUse(targetName)) {
    if (args[2] == "ALIASED_TARGET" || args[2] == "ALIAS_GLOBAL") {
      if (mf.IsAlias(targetName)) {
        prop_exists = true;
        if (args[2] == "ALIASED_TARGET") {

          prop = tgt->GetName();
        }
        if (args[2] == "ALIAS_GLOBAL") {
          prop =
            mf.GetGlobalGenerator()->IsAlias(targetName) ? "TRUE" : "FALSE";
        }
      }
    } else if (!args[2].empty()) {
      cmValue prop_cstr = nullptr;
      prop_cstr = tgt->GetComputedProperty(args[2], mf);
      if (!prop_cstr) {
        prop_cstr = tgt->GetProperty(args[2]);
      }
      if (prop_cstr) {
        prop = *prop_cstr;
        prop_exists = true;
      }
    }
  } else {
    bool issueMessage = false;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0045)) {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (issueMessage) {
      e << "get_target_property() called with non-existent target \""
        << targetName << "\".";
      mf.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }
  if (prop_exists) {
    mf.AddDefinition(var, prop);
    return true;
  }
  mf.AddDefinition(var, var + "-NOTFOUND");
  return true;
}